

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDebugMarkerTests.cpp
# Opt level: O2

TestCaseGroup * deqp::gles2::Functional::createDebugMarkerTests(Context *context)

{
  TestCaseGroup *pTVar1;
  TestNode *this;
  TestCase *pTVar2;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> debugMarkerGroup;
  
  this = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,context->m_testCtx,"debug_marker","GL_EXT_debug_marker tests");
  debugMarkerGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)this;
  pTVar2 = (TestCase *)operator_new(0x78);
  gles2::TestCase::TestCase(pTVar2,context,"supported","Is GL_EXT_debug_marker supported");
  (pTVar2->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_01e227e8;
  tcu::TestNode::addChild(this,(TestNode *)pTVar2);
  pTVar1 = debugMarkerGroup.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pTVar2 = (TestCase *)operator_new(0x78);
  gles2::TestCase::TestCase(pTVar2,context,"random","Random GL_EXT_debug_marker usage");
  (pTVar2->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_01e22838;
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pTVar2);
  pTVar1 = debugMarkerGroup.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pTVar2 = (TestCase *)operator_new(0x78);
  gles2::TestCase::TestCase(pTVar2,context,"invalid","Invalid GL_EXT_debug_marker usage");
  (pTVar2->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_01e22888;
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pTVar2);
  pTVar1 = debugMarkerGroup.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  debugMarkerGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&debugMarkerGroup.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createDebugMarkerTests (Context& context)
{
	de::MovePtr<tcu::TestCaseGroup>	debugMarkerGroup	(new tcu::TestCaseGroup(context.getTestContext(), "debug_marker", "GL_EXT_debug_marker tests"));

	debugMarkerGroup->addChild(new IsSupportedCase	(context));
	debugMarkerGroup->addChild(new RandomCase		(context));
	debugMarkerGroup->addChild(new InvalidCase		(context));

	return debugMarkerGroup.release();
}